

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O3

int serialOpen(char *device,int baud)

{
  int __fd;
  speed_t __speed;
  byte local_58 [4];
  termios local_54;
  
  if (baud < 0xe100) {
    if (baud < 600) {
      if (baud < 0x86) {
        if (baud == 0x32) {
          __speed = 1;
        }
        else if (baud == 0x4b) {
          __speed = 2;
        }
        else {
          if (baud != 0x6e) {
            return -2;
          }
          __speed = 3;
        }
      }
      else if (baud < 200) {
        if (baud == 0x86) {
          __speed = 4;
        }
        else {
          if (baud != 0x96) {
            return -2;
          }
          __speed = 5;
        }
      }
      else if (baud == 200) {
        __speed = 6;
      }
      else {
        if (baud != 300) {
          return -2;
        }
        __speed = 7;
      }
    }
    else if (baud < 0x12c0) {
      if (baud < 0x708) {
        if (baud == 600) {
          __speed = 8;
        }
        else {
          if (baud != 0x4b0) {
            return -2;
          }
          __speed = 9;
        }
      }
      else if (baud == 0x708) {
        __speed = 10;
      }
      else {
        if (baud != 0x960) {
          return -2;
        }
        __speed = 0xb;
      }
    }
    else if (baud < 0x4b00) {
      if (baud == 0x12c0) {
        __speed = 0xc;
      }
      else {
        if (baud != 0x2580) {
          return -2;
        }
        __speed = 0xd;
      }
    }
    else if (baud == 0x4b00) {
      __speed = 0xe;
    }
    else {
      if (baud != 0x9600) {
        return -2;
      }
      __speed = 0xf;
    }
  }
  else if (baud < 1000000) {
    if (baud < 0x70800) {
      if (baud == 0xe100) {
        __speed = 0x1001;
      }
      else if (baud == 0x1c200) {
        __speed = 0x1002;
      }
      else {
        if (baud != 0x38400) {
          return -2;
        }
        __speed = 0x1003;
      }
    }
    else if (baud < 0x8ca00) {
      if (baud == 0x70800) {
        __speed = 0x1004;
      }
      else {
        if (baud != 500000) {
          return -2;
        }
        __speed = 0x1005;
      }
    }
    else if (baud == 0x8ca00) {
      __speed = 0x1006;
    }
    else {
      if (baud != 0xe1000) {
        return -2;
      }
      __speed = 0x1007;
    }
  }
  else if (baud < 2500000) {
    if (baud < 1500000) {
      if (baud == 1000000) {
        __speed = 0x1008;
      }
      else {
        if (baud != 0x119400) {
          return -2;
        }
        __speed = 0x1009;
      }
    }
    else if (baud == 1500000) {
      __speed = 0x100a;
    }
    else {
      if (baud != 2000000) {
        return -2;
      }
      __speed = 0x100b;
    }
  }
  else if (baud < 3500000) {
    if (baud == 2500000) {
      __speed = 0x100c;
    }
    else {
      if (baud != 3000000) {
        return -2;
      }
      __speed = 0x100d;
    }
  }
  else if (baud == 3500000) {
    __speed = 0x100e;
  }
  else {
    if (baud != 4000000) {
      return -2;
    }
    __speed = 0x100f;
  }
  __fd = open(device,0x902);
  if (__fd == -1) {
    __fd = -1;
  }
  else {
    fcntl(__fd,4,2);
    tcgetattr(__fd,&local_54);
    cfmakeraw(&local_54);
    cfsetispeed(&local_54,__speed);
    cfsetospeed(&local_54,__speed);
    local_54.c_cflag = local_54.c_cflag & 0xfffff60f | 0x8b0;
    local_54.c_lflag._0_1_ = (byte)local_54.c_lflag & 0xe4;
    local_54.c_oflag._0_1_ = (byte)local_54.c_oflag & 0xfe;
    local_54.c_cc[5] = 'd';
    local_54.c_cc[6] = '\0';
    tcsetattr(__fd,0,&local_54);
    ioctl(__fd,0x5415,local_58);
    local_58[0] = local_58[0] | 6;
    ioctl(__fd,0x5418,local_58);
    usleep(10000);
  }
  return __fd;
}

Assistant:

int serialOpen(const char *device, const int baud)
{
	struct termios options;
	speed_t myBaud;
	int status, fd;

	switch (baud)
	{
	case 50:
		myBaud = B50;
		break;
	case 75:
		myBaud = B75;
		break;
	case 110:
		myBaud = B110;
		break;
	case 134:
		myBaud = B134;
		break;
	case 150:
		myBaud = B150;
		break;
	case 200:
		myBaud = B200;
		break;
	case 300:
		myBaud = B300;
		break;
	case 600:
		myBaud = B600;
		break;
	case 1200:
		myBaud = B1200;
		break;
	case 1800:
		myBaud = B1800;
		break;
	case 2400:
		myBaud = B2400;
		break;
	case 4800:
		myBaud = B4800;
		break;
	case 9600:
		myBaud = B9600;
		break;
	case 19200:
		myBaud = B19200;
		break;
	case 38400:
		myBaud = B38400;
		break;
	case 57600:
		myBaud = B57600;
		break;
	case 115200:
		myBaud = B115200;
		break;
	case 230400:
		myBaud = B230400;
		break;
	case 460800:
		myBaud = B460800;
		break;
	case 500000:
		myBaud = B500000;
		break;
	case 576000:
		myBaud = B576000;
		break;
	case 921600:
		myBaud = B921600;
		break;
	case 1000000:
		myBaud = B1000000;
		break;
	case 1152000:
		myBaud = B1152000;
		break;
	case 1500000:
		myBaud = B1500000;
		break;
	case 2000000:
		myBaud = B2000000;
		break;
	case 2500000:
		myBaud = B2500000;
		break;
	case 3000000:
		myBaud = B3000000;
		break;
	case 3500000:
		myBaud = B3500000;
		break;
	case 4000000:
		myBaud = B4000000;
		break;

	default:
		return -2;
	}

	if ((fd = open(device, O_RDWR | O_NOCTTY | O_NDELAY | O_NONBLOCK)) == -1)
		return -1;

	fcntl(fd, F_SETFL, O_RDWR);

	// Get and modify current options:

	tcgetattr(fd, &options);

	cfmakeraw(&options);
	cfsetispeed(&options, myBaud);
	cfsetospeed(&options, myBaud);

	options.c_cflag |= (CLOCAL | CREAD);
	options.c_cflag &= ~PARENB;
	options.c_cflag &= ~CSTOPB;
	options.c_cflag &= ~CSIZE;
	options.c_cflag |= CS8;
	options.c_lflag &= ~(ICANON | ECHO | ECHOE | ISIG);
	options.c_oflag &= ~OPOST;

	options.c_cc[VMIN] = 0;
	options.c_cc[VTIME] = 100; // Ten seconds (100 deciseconds)

	tcsetattr(fd, TCSANOW, &options);

	ioctl(fd, TIOCMGET, &status);

	status |= TIOCM_DTR;
	status |= TIOCM_RTS;

	ioctl(fd, TIOCMSET, &status);

	usleep(10000); // 10mS

	return fd;
}